

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_addrinfo.c
# Opt level: O0

Curl_addrinfo * Curl_str2addr(char *address,int port)

{
  int iVar1;
  undefined1 local_20 [4];
  int local_1c;
  in_addr in;
  int port_local;
  char *address_local;
  
  local_1c = port;
  _in = address;
  iVar1 = inet_pton(2,address,local_20);
  if (iVar1 < 1) {
    address_local = (char *)0x0;
  }
  else {
    address_local = (char *)Curl_ip2addr(2,local_20,_in,local_1c);
  }
  return (Curl_addrinfo *)address_local;
}

Assistant:

Curl_addrinfo *Curl_str2addr(char *address, int port)
{
  struct in_addr in;
  if(Curl_inet_pton(AF_INET, address, &in) > 0)
    /* This is a dotted IP address 123.123.123.123-style */
    return Curl_ip2addr(AF_INET, &in, address, port);
#ifdef ENABLE_IPV6
  {
    struct in6_addr in6;
    if(Curl_inet_pton(AF_INET6, address, &in6) > 0)
      /* This is a dotted IPv6 address ::1-style */
      return Curl_ip2addr(AF_INET6, &in6, address, port);
  }
#endif
  return NULL; /* bad input format */
}